

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void unroll(lua_State *L,void *ud)

{
  CallInfo *ci;
  lua_KFunction p_Var1;
  TString *pTVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  TValue *io;
  StkId pSVar6;
  byte bVar7;
  CallInfo *pCVar8;
  uint uVar9;
  byte local_31;
  
  ci = L->ci;
  while (ci != &L->base_ci) {
    uVar5 = ci->callstatus;
    if ((short)uVar5 < 0) {
      if ((uVar5 >> 0x11 & 1) == 0) {
        p_Var1 = (ci->u).c.k;
        uVar9 = 1;
        pCVar8 = ci;
        if ((uVar5 >> 0x15 & 1) != 0) {
          uVar9 = 1;
          if ((uVar5 & 0x7000) != 0) {
            iVar4 = (ci->u2).funcidx;
            local_31 = (byte)(uVar5 >> 0xc) & 7;
            L->allowhook = (byte)(uVar5 >> 0x13) & 1;
            uVar9 = uVar5 >> 0xc & 7;
            pSVar6 = luaF_close(L,(StkId)((long)iVar4 + (long)(L->stack).p),(TStatus)uVar9,1);
            if (local_31 == 4) {
              pTVar2 = L->l_G->memerrmsg;
              (pSVar6->val).value_.gc = (GCObject *)pTVar2;
              bVar7 = pTVar2->tt | 0x40;
            }
            else {
              lVar3 = (L->top).offset;
              (pSVar6->val).value_ = *(Value *)(lVar3 + -0x10);
              bVar7 = *(byte *)(lVar3 + -8);
            }
            (pSVar6->val).tt_ = bVar7;
            (L->top).p = pSVar6 + 1;
            luaD_shrinkstack(L);
            uVar5 = ci->callstatus & 0xffff8fff;
            pCVar8 = L->ci;
          }
          ci->callstatus = uVar5 & 0xffdfffff;
          L->errfunc = (ci->u).c.old_errfunc;
        }
        if ((pCVar8->top).p < (L->top).p) {
          (pCVar8->top).p = (L->top).p;
        }
        iVar4 = (*p_Var1)(L,uVar9,(ci->u).c.ctx);
      }
      else {
        iVar4 = (ci->u2).funcidx;
      }
      luaD_poscall(L,ci,iVar4);
    }
    else {
      luaV_finishOp(L);
      luaV_execute(L,ci);
    }
    ci = L->ci;
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  CallInfo *ci;
  UNUSED(ud);
  while ((ci = L->ci) != &L->base_ci) {  /* something in the stack */
    if (!isLua(ci))  /* C function? */
      finishCcall(L, ci);  /* complete its execution */
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L, ci);  /* execute down to higher C 'boundary' */
    }
  }
}